

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O1

bool __thiscall QPDF::ObjUser::operator<(ObjUser *this,ObjUser *rhs)

{
  byte extraout_var;
  
  if ((int)this->ou_type < (int)rhs->ou_type) {
    return true;
  }
  if (this->ou_type == rhs->ou_type) {
    if (this->pageno < rhs->pageno) {
      return true;
    }
    if (this->pageno == rhs->pageno) {
      std::__cxx11::string::compare((string *)&this->key);
      return (bool)(extraout_var >> 7);
    }
  }
  return false;
}

Assistant:

bool
QPDF::ObjUser::operator<(ObjUser const& rhs) const
{
    if (ou_type < rhs.ou_type) {
        return true;
    }
    if (ou_type == rhs.ou_type) {
        if (pageno < rhs.pageno) {
            return true;
        }
        if (pageno == rhs.pageno) {
            return key < rhs.key;
        }
    }
    return false;
}